

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

int __thiscall
AbstractModuleClient::processNotification
          (AbstractModuleClient *this,char *param_1,string *noteType,TrodesMsg *msg)

{
  bool bVar1;
  binarydata configdata;
  TrodesConfig newConfig;
  allocator local_e9;
  string local_e8;
  TrodesConfig local_c8;
  string local_90;
  string local_70;
  TrodesConfig local_50;
  
  bVar1 = std::operator==(noteType,"config_changed");
  if (bVar1) {
    TrodesConfig::TrodesConfig(&local_c8);
    binarydata::binarydata((binarydata *)&local_e8);
    std::__cxx11::string::string((string *)&local_70,"n",&local_e9);
    TrodesMsg::popcontents<binarydata>(msg,&local_70,(binarydata *)&local_e8);
    std::__cxx11::string::~string((string *)&local_70);
    TrodesConfig::decode(&local_c8,(binarydata *)&local_e8);
    TrodesConfig::TrodesConfig(&local_50,&local_c8);
    MlmWrap::setTrodesConfig(&this->super_MlmWrap,&local_50);
    TrodesConfig::~TrodesConfig(&local_50);
    std::__cxx11::string::~string((string *)&local_e8);
    TrodesConfig::~TrodesConfig(&local_c8);
    return 0;
  }
  bVar1 = std::operator==(noteType,"TIMESTAMP_ADDRESS");
  if (bVar1) {
    TrodesMsg::popstr_abi_cxx11_((string *)&local_c8,msg);
    bVar1 = subToTimestamps(this,(string *)&local_c8);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&local_90,"Could not properly register timestamps socket!\n",&local_e9);
      MlmWrap::error(&local_e8,&this->super_MlmWrap,&local_90);
      std::operator<<((ostream *)&std::cerr,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  else {
    bVar1 = std::operator==(noteType,"TIMESTAMP_ADDRESS_DEREG");
    if (bVar1) {
      unsubToTimestamps(this);
      return 0;
    }
    bVar1 = std::operator==(noteType,"_expired");
    if (!bVar1) {
      return 0;
    }
    TrodesMsg::popstr_abi_cxx11_((string *)&local_c8,msg);
    network_pimpl::remove_client((this->super_MlmWrap).state,(string *)&local_c8);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  return 0;
}

Assistant:

int AbstractModuleClient::processNotification(const char *, std::string noteType, TrodesMsg &msg) {
    int rc = 0;
//    std::cout << "AMC::processNotification: " << noteType << "\n";
    if (noteType == NOTE_CONFIG_CHANGED) {
        TrodesConfig newConfig;
        binarydata configdata;
        msg.popcontents("n", configdata);
        newConfig.decode(configdata);
        setTrodesConfig(newConfig);
    }
    else if(noteType == "TIMESTAMP_ADDRESS"){
        std::string addr = msg.popstr();
//        std::cout << "----address: |" << addr << "|\n";
        if(!subToTimestamps(addr)){
            std::cerr << error("Could not properly register timestamps socket!\n");
        }
    }
    else if(noteType == "TIMESTAMP_ADDRESS_DEREG"){
        //dereg timestamp
        if(!unsubToTimestamps()){
            std::cerr << error("Could not properly de-register timestamps socket!\n");
        }
    }
    else if(noteType == CLIENT_EXPIRED_MSG){
        auto const who = msg.popstr();
        state->remove_client(who);
    }
    // else{
    //     std::cout << "[AMC]: Notification type [" << noteType << "] not recognized.\n";
    // }
    return rc;
}